

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void av1_decode_tg_tiles_and_wrapup
               (AV1Decoder *pbi,uint8_t *data,uint8_t *data_end,uint8_t **p_data_end,int start_tile,
               int end_tile,int initialize_flag)

{
  AV1_COMMON *cm_00;
  AV1CdefSync *cdef_sync;
  uint *puVar1;
  aom_internal_error_info *paVar2;
  undefined8 *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  SequenceHeader *pSVar6;
  YV12_BUFFER_CONFIG *pYVar7;
  aom_reader *r;
  DecWorkerData *pDVar8;
  ThreadData *pTVar9;
  AVxWorker *pAVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  void *__src;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  aom_bit_depth_t aVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  TileBufferDec (*paTVar23) [64];
  int j;
  int iVar24;
  int iVar25;
  size_t sVar26;
  TileDataDec *pTVar27;
  uint8_t *puVar28;
  pthread_mutex_t *ppVar29;
  pthread_cond_t *ppVar30;
  int *piVar31;
  CB_BUFFER *pCVar32;
  long lVar33;
  AVxWorkerInterface *pAVar34;
  byte bVar35;
  uint uVar36;
  uint uVar37;
  undefined2 uVar38;
  int plane_1;
  uint uVar39;
  ulong uVar40;
  size_t *psVar41;
  FRAME_CONTEXT *__dest;
  long lVar42;
  uint uVar43;
  uint uVar44;
  qm_val_t *(*__src_00) [19];
  ulong uVar45;
  ulong uVar46;
  AV1_COMMON *cm;
  AV1DecRowMTSync *dec_row_mt_sync;
  ulong uVar47;
  int tile_row;
  uint uVar48;
  int iVar49;
  ulong uVar50;
  TileInfo *pTVar51;
  int iVar52;
  uint16_t *dest16;
  RestorationInfo *rsi;
  qm_val_t *(*__dest_00) [19];
  long lVar53;
  uint uVar54;
  AVxWorker *pAVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar75;
  undefined1 auVar74 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar78 [16];
  uint local_148;
  uint8_t *local_140;
  AV1_COMMON *cm_1;
  uint local_a0;
  int corrupted;
  int corrupted_1;
  TileBufferDec (*local_90) [64];
  int tile_rows;
  ulong local_80;
  uint local_74;
  int tile_cols;
  ulong local_68;
  ulong local_60;
  uint8_t **local_58;
  qm_val_t *(*local_50) [19];
  int *local_48;
  CFL_CTX *local_40;
  CB_BUFFER *local_38;
  
  cm_00 = &pbi->common;
  (pbi->dcb).xd.error_info = (pbi->common).error;
  if (initialize_flag != 0) {
    if ((((pbi->common).rst_info[0].frame_restoration_type != RESTORE_NONE) ||
        ((pbi->common).rst_info[1].frame_restoration_type != RESTORE_NONE)) ||
       ((pbi->common).rst_info[2].frame_restoration_type != RESTORE_NONE)) {
      rsi = (pbi->common).rst_info;
      av1_alloc_restoration_buffers(cm_00,true);
      uVar40 = 0;
      do {
        av1_alloc_restoration_struct(cm_00,rsi,(uint)(uVar40 != 0));
        if (1 < uVar40) break;
        uVar40 = uVar40 + 1;
        rsi = rsi + 1;
      } while (((pbi->common).seq_params)->monochrome == '\0');
    }
    bVar35 = ((pbi->common).seq_params)->use_highbitdepth;
    iVar52 = 0x11040 << (bVar35 & 0x1f);
    if ((pbi->td).mc_buf_size != iVar52) {
      av1_free_mc_tmp_buf(&pbi->td);
      allocate_mc_tmp_buf(cm_00,&pbi->td,iVar52,(uint)bVar35);
    }
  }
  uVar4 = ((pbi->common).seq_params)->monochrome;
  uVar48 = pbi->max_threads;
  local_58 = p_data_end;
  if ((((int)uVar48 < 2) ||
      ((uVar39 = (pbi->common).tiles.large_scale, uVar39 != 0 && (pbi->ext_tile_debug == 0)))) ||
     (pbi->row_mt == 0)) {
    iVar52 = end_tile - start_tile;
    if (((iVar52 == 0 || end_tile < start_tile) || (int)uVar48 < 2) ||
       ((uVar39 = (pbi->common).tiles.large_scale, uVar39 != 0 && (pbi->ext_tile_debug == 0)))) {
      uVar48 = (pbi->common).tiles.cols;
      uVar40 = (ulong)uVar48;
      uVar39 = (pbi->common).tiles.rows;
      uVar47 = (ulong)uVar39;
      uVar54 = pbi->dec_tile_row;
      uVar36 = pbi->dec_tile_col;
      uVar44 = (pbi->common).tiles.large_scale;
      if (uVar44 == 0) {
        local_a0 = pbi->inv_tile_order;
        uVar45 = 0;
        uVar50 = 0;
        uVar46 = uVar47;
        uVar43 = uVar48;
        uVar37 = local_a0;
      }
      else {
        uVar43 = uVar48;
        if ((int)uVar36 < (int)uVar48) {
          uVar43 = uVar36;
        }
        uVar37 = uVar39;
        if ((int)uVar54 < (int)uVar39) {
          uVar37 = uVar54;
        }
        bVar57 = (int)uVar54 < 0;
        uVar14 = uVar37;
        if (bVar57) {
          uVar14 = 0;
        }
        uVar50 = (ulong)uVar14;
        uVar46 = (ulong)(uVar37 + 1);
        if (bVar57) {
          uVar46 = uVar47;
        }
        uVar45 = (ulong)uVar43;
        uVar43 = uVar43 + 1;
        if ((int)uVar36 < 0) {
          uVar45 = 0;
          uVar43 = uVar48;
        }
        bVar56 = pbi->inv_tile_order != 0;
        local_a0 = (uint)(bVar57 && bVar56);
        uVar37 = (uint)((int)uVar36 < 0 && bVar56);
      }
      if (((((int)uVar46 <= (int)uVar50) || ((int)uVar43 <= (int)uVar45)) ||
          (end_tile < (int)((int)uVar50 * uVar48 + (int)uVar45))) ||
         ((int)(((int)uVar46 + -1) * uVar48 + uVar43) <= start_tile)) goto LAB_009f4dc3;
      if (uVar44 == 0) {
        bVar35 = (pbi->common).features.disable_cdf_update ^ 1;
      }
      else {
        bVar35 = 0;
      }
      local_90 = pbi->tile_buffers;
      _tile_rows = uVar47;
      _tile_cols = uVar40;
      local_68 = uVar46;
      local_60 = uVar45;
      if (uVar44 == 0) {
        if ((int)uVar39 < 1) {
          local_140 = (uint8_t *)0x0;
        }
        else {
          paVar2 = &pbi->error;
          lVar42 = uVar40 << 4;
          psVar41 = &pbi->tile_buffers[0][0].size;
          uVar47 = 0;
          iVar52 = 0;
          local_80 = uVar50;
          do {
            if (0 < (int)uVar40) {
              lVar53 = 0;
              iVar49 = iVar52;
              do {
                if (iVar49 <= end_tile && start_tile <= iVar49) {
                  if (data_end <= data) {
                    aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                       "Data ended before all tiles were read.");
                  }
                  if (end_tile == iVar49) {
                    uVar40 = (long)data_end - (long)data;
                  }
                  else {
                    iVar73 = pbi->tile_size_bytes;
                    if ((ulong)((long)data_end - (long)data) <= (long)iVar73 - 1U) {
                      aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                         "Not enough data to read tile size");
                    }
                    sVar26 = mem_get_varsize(data,iVar73);
                    uVar40 = sVar26 + 1;
                    data = data + iVar73;
                    if ((ulong)((long)data_end - (long)data) < uVar40) {
                      aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                         "Truncated packet or corrupt tile size");
                    }
                  }
                  *(uint8_t **)((long)psVar41 + lVar53 + -8) = data;
                  *(ulong *)((long)psVar41 + lVar53) = uVar40;
                  data = data + uVar40;
                }
                iVar49 = iVar49 + 1;
                lVar53 = lVar53 + 0x10;
              } while (lVar42 != lVar53);
              iVar52 = iVar52 + (int)_tile_cols;
              uVar50 = local_80;
              uVar40 = _tile_cols;
            }
            uVar47 = uVar47 + 1;
            psVar41 = psVar41 + 0x80;
          } while (uVar47 != _tile_rows);
          local_140 = (uint8_t *)0x0;
          uVar39 = (uint)_tile_rows;
        }
      }
      else if (pbi->ext_tile_debug == 0) {
        local_90[(int)uVar54][(int)uVar36].data = data;
        uVar48 = pbi->coded_tile_data_size;
        local_90[(int)uVar54][(int)uVar36].size = (ulong)uVar48;
        local_140 = data + uVar48;
      }
      else {
        local_140 = get_ls_tile_buffers(pbi,data,data_end,local_90);
      }
      uVar39 = uVar39 * (int)uVar40;
      if ((pbi->tile_data == (TileDataDec *)0x0) || (uVar39 != pbi->allocated_tiles)) {
        aom_free(pbi->tile_data);
        pbi->allocated_tiles = 0;
        pTVar27 = (TileDataDec *)aom_memalign(0x20,(long)(int)uVar39 * 0x53a0);
        pbi->tile_data = pTVar27;
        if (pTVar27 == (TileDataDec *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->tile_data");
        }
        pbi->allocated_tiles = uVar39;
        if (0 < (int)uVar39) {
          lVar42 = 0;
          do {
            pTVar27 = pbi->tile_data;
            puVar3 = (undefined8 *)((long)&(pTVar27->dec_row_mt_sync).mi_rows_parse_done + lVar42);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)&(pTVar27->dec_row_mt_sync).sync_range + lVar42);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)&(pTVar27->dec_row_mt_sync).allocated_sb_rows + lVar42);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)&(pTVar27->dec_row_mt_sync).mutex_ + lVar42);
            *puVar3 = 0;
            puVar3[1] = 0;
            lVar42 = lVar42 + 0x53a0;
          } while ((ulong)uVar39 * 0x53a0 - lVar42 != 0);
        }
        pbi->allocated_row_mt_sync_rows = 0;
      }
      pTVar9 = &pbi->td;
      local_74 = uVar39;
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar28 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar28;
        if (puVar28 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      (pbi->td).read_coeffs_tx_intra_block_visit = read_coeffs_tx_intra_block;
      (pbi->td).read_coeffs_tx_inter_block_visit = av1_read_coeffs_txb;
      (pbi->td).predict_and_recon_intra_block_visit = predict_and_reconstruct_intra_block;
      (pbi->td).inverse_tx_inter_block_visit = inverse_transform_inter_block;
      (pbi->td).predict_inter_block_visit = predict_inter_block;
      (pbi->td).cfl_store_inter_block_visit = cfl_store_inter_block;
      memcpy(pTVar9,pbi,0x3b60);
      (pbi->td).dcb.corrupted = 0;
      puVar28 = (pbi->td).mc_buf[1];
      (pbi->td).dcb.mc_buf[0] = (pbi->td).mc_buf[0];
      (pbi->td).dcb.mc_buf[1] = puVar28;
      (pbi->td).dcb.xd.tmp_conv_dst = (pbi->td).tmp_conv_dst;
      puVar28 = (pbi->td).tmp_obmc_bufs[1];
      (pbi->td).dcb.xd.tmp_obmc_bufs[0] = (pbi->td).tmp_obmc_bufs[0];
      (pbi->td).dcb.xd.tmp_obmc_bufs[1] = puVar28;
      local_38 = &(pbi->td).cb_buffer_base;
      pTVar51 = &(pbi->td).dcb.xd.tile;
      paVar2 = &pbi->error;
      local_40 = &(pbi->td).dcb.xd.cfl;
      local_48 = &(pbi->dcb).corrupted;
      local_50 = (pbi->td).dcb.xd.plane[0].seg_iqmatrix;
      do {
        paTVar23 = local_90;
        uVar48 = ~(uint)uVar50 + tile_rows;
        if (local_a0 == 0) {
          uVar48 = (uint)uVar50;
        }
        lVar42 = (long)(int)uVar48;
        uVar47 = local_60 & 0xffffffff;
        local_80 = uVar50;
        do {
          uVar54 = (uint)uVar47;
          uVar39 = ~uVar54 + (int)uVar40;
          if (uVar37 == 0) {
            uVar39 = uVar54;
          }
          lVar53 = (pbi->common).tiles.cols * lVar42;
          iVar52 = (int)lVar53 + uVar39;
          if (iVar52 <= end_tile && start_tile <= iVar52) {
            pTVar27 = pbi->tile_data;
            (pbi->td).bit_reader = &pTVar27[lVar53 + (int)uVar39].bit_reader;
            memset(local_38,0,0x30000);
            av1_tile_init(pTVar51,cm_00,uVar48,uVar39);
            (pbi->td).dcb.xd.current_base_qindex = (pbi->common).quant_params.base_qindex;
            puVar28 = paTVar23[lVar42][(int)uVar39].data;
            sVar26 = paTVar23[lVar42][(int)uVar39].size;
            r = (pbi->td).bit_reader;
            if ((ulong)((long)data_end - (long)puVar28) <= sVar26 - 1) {
              (pTVar9->dcb).xd.mi_row = pTVar51->mi_row_start;
              aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                 "Truncated packet or corrupt tile length");
            }
            iVar52 = aom_reader_init(r,puVar28,sVar26);
            if (iVar52 != 0) {
              (pTVar9->dcb).xd.mi_row = pTVar51->mi_row_start;
              aom_internal_error(paVar2,AOM_CODEC_MEM_ERROR,"Failed to allocate bool decoder %d",1);
            }
            r->allow_update_cdf = bVar35;
            pSVar6 = (pbi->common).seq_params;
            uVar5 = pSVar6->monochrome;
            uVar40 = 0;
            __dest_00 = local_50;
            do {
              if (*(char *)((long)(__dest_00 + -2) + 0x80) == '\0') {
                uVar15 = *(undefined8 *)(pbi->common).quant_params.y_dequant_QTX;
                uVar16 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 2);
                uVar17 = *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.y_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar17;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar15;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar16;
                __src_00 = (pbi->common).quant_params.y_iqmatrix;
              }
              else if (uVar40 == 1) {
                uVar15 = *(undefined8 *)(pbi->common).quant_params.u_dequant_QTX;
                uVar16 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 2);
                uVar17 = *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.u_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar17;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar15;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar16;
                __src_00 = (pbi->common).quant_params.u_iqmatrix;
              }
              else {
                uVar15 = *(undefined8 *)(pbi->common).quant_params.v_dequant_QTX;
                uVar16 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 2);
                uVar17 = *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 6);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x78) =
                     *(undefined8 *)((pbi->common).quant_params.v_dequant_QTX + 4);
                *(undefined8 *)((long)(__dest_00 + -1) + 0x80) = uVar17;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x68) = uVar15;
                *(undefined8 *)((long)(__dest_00 + -1) + 0x70) = uVar16;
                __src_00 = (pbi->common).quant_params.v_iqmatrix;
              }
              memcpy(__dest_00,__src_00,0x4c0);
              if (uVar5 != '\0') break;
              __dest_00 = (qm_val_t *(*) [19])((long)(__dest_00 + 0x11) + 0x18);
              bVar57 = uVar40 < 2;
              uVar40 = uVar40 + 1;
            } while (bVar57);
            (pbi->td).dcb.xd.mi_stride = (pbi->common).mi_params.mi_stride;
            (pbi->td).dcb.xd.error_info = (pbi->common).error;
            cfl_init(local_40,pSVar6);
            uVar5 = ((pbi->common).seq_params)->monochrome;
            lVar33 = 0;
            do {
              (pbi->td).dcb.xd.above_entropy_context[lVar33] =
                   (pbi->common).above_contexts.entropy[lVar33][lVar42];
              lVar33 = lVar33 + 1;
            } while ((ulong)(uVar5 == '\0') * 2 + 1 != lVar33);
            (pbi->td).dcb.xd.above_partition_context =
                 (pbi->common).above_contexts.partition[lVar42];
            (pbi->td).dcb.xd.above_txfm_context = (pbi->common).above_contexts.txfm[lVar42];
            __dest = &pTVar27[lVar53 + (int)uVar39].tctx;
            memcpy(__dest,(pbi->common).fc,0x52fc);
            (pbi->td).dcb.xd.tile_ctx = __dest;
            decode_tile(pbi,pTVar9,uVar48,uVar39);
            aom_merge_corrupted_flag(local_48,(pbi->td).dcb.corrupted);
            uVar40 = _tile_cols;
            if ((pbi->dcb).corrupted != 0) {
              aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
            }
          }
          uVar47 = (ulong)(uVar54 + 1);
        } while (uVar54 + 1 != uVar43);
        uVar48 = (int)local_80 + 1;
        uVar50 = (ulong)uVar48;
      } while (uVar48 != (uint)local_68);
      if ((pbi->common).tiles.large_scale != 0) {
        data = local_140;
        if (local_74 != 1) goto LAB_009f4dc3;
        pTVar27 = pbi->tile_data;
        goto LAB_009f6d8e;
      }
      pTVar27 = pbi->tile_data;
      goto LAB_009f6d7a;
    }
    uVar54 = (pbi->common).tiles.cols;
    iVar49 = (pbi->common).tiles.rows;
    if (uVar39 == 0) {
      iVar73 = 0;
      iVar25 = iVar49;
      uVar39 = 0;
      uVar36 = uVar54;
    }
    else {
      iVar24 = pbi->dec_tile_row;
      uVar44 = pbi->dec_tile_col;
      uVar39 = uVar54;
      if ((int)uVar44 < (int)uVar54) {
        uVar39 = uVar44;
      }
      iVar73 = iVar49;
      if (iVar24 < iVar49) {
        iVar73 = iVar24;
      }
      iVar25 = iVar73 + 1;
      if (iVar24 < 0) {
        iVar73 = 0;
        iVar25 = iVar49;
      }
      uVar36 = uVar39 + 1;
      if ((int)uVar44 < 0) {
        uVar39 = 0;
        uVar36 = uVar54;
      }
    }
    uVar44 = iVar52 + 1;
    if ((int)uVar48 <= iVar52) {
      uVar44 = uVar48;
    }
    if (((iVar73 < iVar25) && ((int)uVar39 < (int)uVar36)) &&
       (((int)(iVar73 * uVar54 + uVar39) <= end_tile &&
        (start_tile < (int)((iVar25 + -1) * uVar54 + uVar36))))) {
      decode_mt_init(pbi);
      if ((pbi->common).tiles.large_scale == 0) {
        lVar42 = (long)(pbi->common).tiles.rows;
        if (0 < lVar42) {
          uVar48 = (pbi->common).tiles.cols;
          paVar2 = &pbi->error;
          psVar41 = &pbi->tile_buffers[0][0].size;
          lVar53 = 0;
          iVar52 = 0;
          do {
            if (0 < (int)uVar48) {
              lVar33 = 0;
              iVar24 = iVar52;
              do {
                if (iVar24 <= end_tile && start_tile <= iVar24) {
                  if (data_end <= data) {
                    aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                       "Data ended before all tiles were read.");
                  }
                  if (end_tile == iVar24) {
                    uVar40 = (long)data_end - (long)data;
                  }
                  else {
                    iVar75 = pbi->tile_size_bytes;
                    if ((ulong)((long)data_end - (long)data) <= (long)iVar75 - 1U) {
                      aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                         "Not enough data to read tile size");
                    }
                    sVar26 = mem_get_varsize(data,iVar75);
                    uVar40 = sVar26 + 1;
                    data = data + iVar75;
                    if ((ulong)((long)data_end - (long)data) < uVar40) {
                      aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                         "Truncated packet or corrupt tile size");
                    }
                  }
                  *(uint8_t **)((long)psVar41 + lVar33 + -8) = data;
                  *(ulong *)((long)psVar41 + lVar33) = uVar40;
                  data = data + uVar40;
                }
                iVar24 = iVar24 + 1;
                lVar33 = lVar33 + 0x10;
              } while ((ulong)uVar48 << 4 != lVar33);
              iVar52 = iVar52 + uVar48;
            }
            lVar53 = lVar53 + 1;
            psVar41 = psVar41 + 0x80;
          } while (lVar53 != lVar42);
        }
        local_140 = (uint8_t *)0x0;
      }
      else {
        local_140 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
      }
      uVar43 = iVar49 * uVar54;
      if ((pbi->tile_data == (TileDataDec *)0x0) || (uVar43 != pbi->allocated_tiles)) {
        aom_free(pbi->tile_data);
        pbi->allocated_tiles = 0;
        pTVar27 = (TileDataDec *)aom_memalign(0x20,(long)(int)uVar43 * 0x53a0);
        pbi->tile_data = pTVar27;
        if (pTVar27 == (TileDataDec *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->tile_data");
        }
        pbi->allocated_tiles = uVar43;
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            pTVar27 = pbi->tile_data;
            *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).mi_rows_parse_done + lVar42) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).sync_range + lVar42) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).allocated_sb_rows + lVar42) =
                 (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).mutex_ + lVar42) =
                 (undefined1  [16])0x0;
            lVar42 = lVar42 + 0x53a0;
          } while ((ulong)uVar43 * 0x53a0 - lVar42 != 0);
        }
        pbi->allocated_row_mt_sync_rows = 0;
      }
      if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
        puVar28 = (uint8_t *)aom_memalign(0x10,0x8000);
        (pbi->dcb).xd.seg_mask = puVar28;
        if (puVar28 == (uint8_t *)0x0) {
          aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate pbi->dcb.xd.seg_mask");
        }
      }
      if (0 < iVar49) {
        iVar52 = 0;
        do {
          if (0 < (int)uVar54) {
            lVar42 = 0;
            uVar40 = 0;
            do {
              av1_tile_init((TileInfo *)
                            ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)iVar52].
                                    tctx.txb_skip_cdf + -2) + 0x3c + lVar42),cm_00,iVar52,
                            (int)uVar40);
              uVar40 = uVar40 + 1;
              lVar42 = lVar42 + 0x53a0;
            } while (uVar54 != uVar40);
          }
          iVar52 = iVar52 + 1;
        } while (iVar52 != iVar49);
      }
      tile_mt_queue(pbi,uVar54,iVar49,iVar73,iVar25,uVar39,uVar36,start_tile,end_tile);
      pAVar34 = aom_get_worker_interface();
      uVar40 = (ulong)uVar44;
      if (0 < (int)uVar44) {
        uVar47 = 0;
        do {
          pAVar55 = pbi->tile_workers + uVar47;
          pDVar8 = pbi->thread_data;
          memcpy(pDVar8[uVar47].td,pbi,0x3b60);
          pTVar9 = pDVar8[uVar47].td;
          (pTVar9->dcb).corrupted = 0;
          (pTVar9->dcb).mc_buf[0] = pTVar9->mc_buf[0];
          ((pDVar8[uVar47].td)->dcb).mc_buf[1] = (pDVar8[uVar47].td)->mc_buf[1];
          pTVar9 = pDVar8[uVar47].td;
          (pTVar9->dcb).xd.tmp_conv_dst = pTVar9->tmp_conv_dst;
          if (uVar47 != 0) {
            (pTVar9->dcb).xd.seg_mask = pTVar9->seg_mask;
          }
          lVar42 = 0;
          do {
            pTVar9 = pDVar8[uVar47].td;
            (pTVar9->dcb).xd.tmp_obmc_bufs[lVar42] = pTVar9->tmp_obmc_bufs[lVar42];
            lVar42 = lVar42 + 1;
          } while (lVar42 == 1);
          (*pAVar34->sync)(pAVar55);
          pAVar55->hook = tile_worker_hook;
          pAVar55->data1 = pDVar8 + uVar47;
          pAVar55->data2 = pbi;
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar40);
      }
      pAVar34 = aom_get_worker_interface();
      if (0 < (int)uVar44) {
        lVar42 = uVar40 + 1;
        lVar53 = uVar40 * 0x38;
        do {
          pAVar10 = pbi->tile_workers;
          pAVar55 = (AVxWorker *)((long)&pAVar10[-1].impl_ + lVar53);
          *(uint8_t **)(*(long *)((long)&pAVar10[-1].data1 + lVar53) + 8) = data_end;
          *(undefined4 *)((long)&pAVar10[-1].had_error + lVar53) = 0;
          if (lVar42 == 2) {
            (*pAVar34->execute)(pAVar55);
          }
          else {
            (*pAVar34->launch)(pAVar55);
          }
          lVar42 = lVar42 + -1;
          lVar53 = lVar53 + -0x38;
        } while (1 < lVar42);
      }
      pAVar34 = aom_get_worker_interface();
      corrupted_1 = 0;
      if (0 < (int)uVar44) {
        lVar53 = uVar40 + 1;
        lVar42 = uVar40 * 0x38;
        do {
          iVar52 = (*pAVar34->sync)((AVxWorker *)((long)&pbi->tile_workers[-1].impl_ + lVar42));
          aom_merge_corrupted_flag(&corrupted_1,(uint)(iVar52 == 0));
          lVar53 = lVar53 + -1;
          lVar42 = lVar42 + -0x38;
        } while (1 < lVar53);
      }
      (pbi->dcb).corrupted = corrupted_1;
      if (corrupted_1 != 0) {
        aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
      }
      uVar48 = (pbi->common).tiles.large_scale;
      data = local_140;
      goto joined_r0x009f5c3c;
    }
  }
  else {
    uVar54 = (pbi->common).tiles.cols;
    iVar52 = (pbi->common).tiles.rows;
    if (uVar39 == 0) {
      uVar39 = 0;
      iVar49 = 0;
      iVar73 = iVar52;
      uVar36 = uVar54;
    }
    else {
      iVar25 = pbi->dec_tile_row;
      uVar44 = pbi->dec_tile_col;
      uVar39 = uVar54;
      if ((int)uVar44 < (int)uVar54) {
        uVar39 = uVar44;
      }
      iVar49 = iVar52;
      if (iVar25 < iVar52) {
        iVar49 = iVar25;
      }
      iVar73 = iVar49 + 1;
      if (iVar25 < 0) {
        iVar49 = 0;
        iVar73 = iVar52;
      }
      uVar36 = uVar39 + 1;
      if ((int)uVar44 < 0) {
        uVar39 = 0;
        uVar36 = uVar54;
      }
    }
    if ((((iVar73 <= iVar49) || ((int)uVar36 <= (int)uVar39)) ||
        (end_tile < (int)(iVar49 * uVar54 + uVar39))) ||
       ((int)((iVar73 + -1) * uVar54 + uVar36) <= start_tile)) goto LAB_009f4dc3;
    decode_mt_init(pbi);
    if ((pbi->common).tiles.large_scale == 0) {
      lVar42 = (long)(pbi->common).tiles.rows;
      if (lVar42 < 1) {
        local_140 = (uint8_t *)0x0;
      }
      else {
        uVar44 = (pbi->common).tiles.cols;
        paVar2 = &pbi->error;
        psVar41 = &pbi->tile_buffers[0][0].size;
        lVar53 = 0;
        iVar25 = 0;
        do {
          if (0 < (int)uVar44) {
            lVar33 = 0;
            iVar24 = iVar25;
            do {
              if (iVar24 <= end_tile && start_tile <= iVar24) {
                if (data_end <= data) {
                  aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                     "Data ended before all tiles were read.");
                }
                if (end_tile == iVar24) {
                  uVar40 = (long)data_end - (long)data;
                }
                else {
                  iVar75 = pbi->tile_size_bytes;
                  if ((ulong)((long)data_end - (long)data) <= (long)iVar75 - 1U) {
                    aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                       "Not enough data to read tile size");
                  }
                  sVar26 = mem_get_varsize(data,iVar75);
                  uVar40 = sVar26 + 1;
                  data = data + iVar75;
                  if ((ulong)((long)data_end - (long)data) < uVar40) {
                    aom_internal_error(paVar2,AOM_CODEC_CORRUPT_FRAME,
                                       "Truncated packet or corrupt tile size");
                  }
                }
                *(uint8_t **)((long)psVar41 + lVar33 + -8) = data;
                *(ulong *)((long)psVar41 + lVar33) = uVar40;
                data = data + uVar40;
              }
              iVar24 = iVar24 + 1;
              lVar33 = lVar33 + 0x10;
            } while ((ulong)uVar44 << 4 != lVar33);
            iVar25 = iVar25 + uVar44;
          }
          lVar53 = lVar53 + 1;
          psVar41 = psVar41 + 0x80;
        } while (lVar53 != lVar42);
        local_140 = (uint8_t *)0x0;
      }
    }
    else {
      local_140 = get_ls_tile_buffers(pbi,data,data_end,pbi->tile_buffers);
    }
    uVar43 = iVar52 * uVar54;
    if (pbi->tile_data == (TileDataDec *)0x0) {
LAB_009f64ed:
      aom_free(pbi->tile_data);
      pbi->allocated_tiles = 0;
      pTVar27 = (TileDataDec *)aom_memalign(0x20,(long)(int)uVar43 * 0x53a0);
      pbi->tile_data = pTVar27;
      if (pTVar27 == (TileDataDec *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->tile_data");
      }
      pbi->allocated_tiles = uVar43;
      if (0 < (int)uVar43) {
        lVar42 = 0;
        do {
          pTVar27 = pbi->tile_data;
          *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).mi_rows_parse_done + lVar42) =
               (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).sync_range + lVar42) =
               (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).allocated_sb_rows + lVar42) =
               (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&(pTVar27->dec_row_mt_sync).mutex_ + lVar42) =
               (undefined1  [16])0x0;
          lVar42 = lVar42 + 0x53a0;
        } while ((ulong)uVar43 * 0x53a0 - lVar42 != 0);
      }
      pbi->allocated_row_mt_sync_rows = 0;
    }
    else if (uVar43 != pbi->allocated_tiles) {
      if (0 < pbi->allocated_tiles) {
        lVar42 = 0x5360;
        lVar53 = 0;
        do {
          av1_dec_row_mt_dealloc
                    ((AV1DecRowMTSync *)
                     ((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar42));
          lVar53 = lVar53 + 1;
          lVar42 = lVar42 + 0x53a0;
        } while (lVar53 < pbi->allocated_tiles);
      }
      goto LAB_009f64ed;
    }
    if ((pbi->dcb).xd.seg_mask == (uint8_t *)0x0) {
      puVar28 = (uint8_t *)aom_memalign(0x10,0x8000);
      (pbi->dcb).xd.seg_mask = puVar28;
      if (puVar28 == (uint8_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->dcb.xd.seg_mask");
      }
    }
    if (iVar52 < 1) {
      uVar44 = 0;
      local_148 = 0;
    }
    else {
      iVar25 = 0;
      local_148 = 0;
      uVar44 = 0;
      do {
        if (0 < (int)uVar54) {
          lVar42 = 0;
          uVar40 = 0;
          do {
            pTVar51 = (TileInfo *)
                      ((long)(pbi->tile_data[(long)(pbi->common).tiles.cols * (long)iVar25].tctx.
                              txb_skip_cdf + -2) + 0x3c + lVar42);
            av1_tile_init(pTVar51,cm_00,iVar25,(int)uVar40);
            iVar24 = av1_get_sb_rows_in_tile(cm_00,pTVar51);
            if ((int)local_148 <= iVar24) {
              local_148 = av1_get_sb_rows_in_tile(cm_00,pTVar51);
            }
            iVar24 = av1_get_sb_rows_in_tile(cm_00,pTVar51);
            uVar44 = (uVar44 - (iVar24 == 1)) + 2;
            uVar40 = uVar40 + 1;
            lVar42 = lVar42 + 0x53a0;
          } while (uVar54 != uVar40);
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != iVar52);
    }
    if ((int)uVar44 < (int)uVar48) {
      uVar48 = uVar44;
    }
    lVar42 = (long)(int)local_148;
    if (pbi->allocated_row_mt_sync_rows != local_148) {
      if (0 < (int)uVar43) {
        uVar40 = 0;
        do {
          pTVar27 = pbi->tile_data;
          dec_row_mt_sync = &pTVar27[uVar40].dec_row_mt_sync;
          av1_dec_row_mt_dealloc(dec_row_mt_sync);
          pTVar27[uVar40].dec_row_mt_sync.allocated_sb_rows = local_148;
          ppVar29 = (pthread_mutex_t *)aom_malloc(lVar42 * 0x28);
          dec_row_mt_sync->mutex_ = ppVar29;
          if (ppVar29 == (pthread_mutex_t *)0x0) {
            aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate dec_row_mt_sync->mutex_");
          }
          if ((0 < (int)local_148) && (dec_row_mt_sync->mutex_ != (pthread_mutex_t *)0x0)) {
            lVar53 = 0;
            do {
              pthread_mutex_init((pthread_mutex_t *)((long)dec_row_mt_sync->mutex_ + lVar53),
                                 (pthread_mutexattr_t *)0x0);
              lVar53 = lVar53 + 0x28;
            } while ((ulong)local_148 * 0x28 != lVar53);
          }
          ppVar30 = (pthread_cond_t *)aom_malloc(lVar42 * 0x30);
          pTVar27[uVar40].dec_row_mt_sync.cond_ = ppVar30;
          if (ppVar30 == (pthread_cond_t *)0x0) {
            aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate dec_row_mt_sync->cond_");
          }
          if ((0 < (int)local_148) &&
             (pTVar27[uVar40].dec_row_mt_sync.cond_ != (pthread_cond_t *)0x0)) {
            lVar53 = 0;
            do {
              pthread_cond_init((pthread_cond_t *)
                                ((long)pTVar27[uVar40].dec_row_mt_sync.cond_ + lVar53),
                                (pthread_condattr_t *)0x0);
              lVar53 = lVar53 + 0x30;
            } while ((ulong)local_148 * 0x30 != lVar53);
          }
          piVar31 = (int *)aom_malloc(lVar42 * 4);
          pTVar27[uVar40].dec_row_mt_sync.cur_sb_col = piVar31;
          if (piVar31 == (int *)0x0) {
            aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate dec_row_mt_sync->cur_sb_col");
          }
          pTVar27[uVar40].dec_row_mt_sync.sync_range = 1;
          uVar40 = uVar40 + 1;
        } while (uVar40 != uVar43);
      }
      pbi->allocated_row_mt_sync_rows = local_148;
    }
    tile_mt_queue(pbi,uVar54,iVar52,iVar49,iVar73,uVar39,uVar36,start_tile,end_tile);
    bVar35 = (byte)((pbi->common).seq_params)->mib_size_log2;
    iVar52 = (((pbi->common).mi_params.mi_cols >> (bVar35 & 0x1f)) + 1) *
             (((pbi->common).mi_params.mi_rows >> (bVar35 & 0x1f)) + 1);
    if (pbi->cb_buffer_alloc_size < iVar52) {
      av1_dec_free_cb_buf(pbi);
      pCVar32 = (CB_BUFFER *)aom_memalign(0x20,(long)iVar52 * 0x3b000);
      pbi->cb_buffer_base = pCVar32;
      if (pCVar32 == (CB_BUFFER *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->cb_buffer_base");
      }
      memset(pbi->cb_buffer_base,0,(long)iVar52 * 0x3b000);
      pbi->cb_buffer_alloc_size = iVar52;
    }
    (pbi->frame_row_mt_info).tile_rows_start = iVar49;
    (pbi->frame_row_mt_info).tile_rows_end = iVar73;
    (pbi->frame_row_mt_info).tile_cols_start = uVar39;
    (pbi->frame_row_mt_info).tile_cols_end = uVar36;
    (pbi->frame_row_mt_info).start_tile = start_tile;
    (pbi->frame_row_mt_info).end_tile = end_tile;
    (pbi->frame_row_mt_info).mi_rows_to_decode = 0;
    (pbi->frame_row_mt_info).mi_rows_parse_done = 0;
    (pbi->frame_row_mt_info).mi_rows_decode_started = 0;
    (pbi->frame_row_mt_info).row_mt_exit = 0;
    lVar33 = (long)(int)uVar39 * 0x53a0 + 0x5398;
    lVar53 = lVar33;
    uVar54 = uVar39;
    do {
      iVar52 = (pbi->common).tiles.cols * iVar49;
      if ((int)(uVar54 + iVar52) <= end_tile && start_tile <= (int)(uVar54 + iVar52)) {
        pTVar27 = pbi->tile_data;
        *(undefined8 *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x34 + lVar53) = 0;
        *(undefined4 *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x3c + lVar53) = 0;
        uVar37 = -1 << ((byte)((pbi->common).seq_params)->mib_size_log2 & 0x1f);
        *(uint *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x2c + lVar53) =
             (*(int *)((long)pTVar27 + lVar53 + -0x5394 + (long)iVar52 * 0x53a0) -
             *(int *)((long)pTVar27 + lVar53 + -0x5398 + (long)iVar52 * 0x53a0)) + ~uVar37 & uVar37;
        *(uint *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x30 + lVar53) =
             (~uVar37 + *(int *)((long)pTVar27 + lVar53 + -0x538c + (long)iVar52 * 0x53a0)) -
             *(int *)((long)pTVar27 + lVar53 + -0x5390 + (long)iVar52 * 0x53a0) & uVar37;
        iVar25 = av1_get_intrabc_extra_top_right_sb_delay(cm_00);
        *(int *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x28 + lVar53) = iVar25;
        piVar31 = &(pbi->frame_row_mt_info).mi_rows_to_decode;
        *piVar31 = *piVar31 +
                   *(int *)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x2c + lVar53);
        memset(*(void **)((long)(pTVar27[iVar52].tctx.txb_skip_cdf + -2) + 0x1c + lVar53),0xff,
               lVar42 << 2);
      }
      uVar54 = uVar54 + 1;
      lVar53 = lVar53 + 0x53a0;
    } while ((uVar36 != uVar54) ||
            (iVar49 = iVar49 + 1, lVar53 = lVar33, uVar54 = uVar39, iVar49 != iVar73));
    if (pbi->row_mt_mutex_ == (pthread_mutex_t *)0x0) {
      ppVar29 = (pthread_mutex_t *)aom_malloc(0x28);
      pbi->row_mt_mutex_ = ppVar29;
      if (ppVar29 == (pthread_mutex_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->row_mt_mutex_");
      }
      if (pbi->row_mt_mutex_ != (pthread_mutex_t *)0x0) {
        pthread_mutex_init((pthread_mutex_t *)pbi->row_mt_mutex_,(pthread_mutexattr_t *)0x0);
      }
    }
    if (pbi->row_mt_cond_ == (pthread_cond_t *)0x0) {
      ppVar30 = (pthread_cond_t *)aom_malloc(0x30);
      pbi->row_mt_cond_ = ppVar30;
      if (ppVar30 == (pthread_cond_t *)0x0) {
        aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate pbi->row_mt_cond_");
      }
      if ((pthread_cond_t *)pbi->row_mt_cond_ != (pthread_cond_t *)0x0) {
        pthread_cond_init((pthread_cond_t *)pbi->row_mt_cond_,(pthread_condattr_t *)0x0);
      }
    }
    pAVar34 = aom_get_worker_interface();
    uVar40 = (ulong)uVar48;
    if (0 < (int)uVar44) {
      uVar47 = 0;
      do {
        pAVar55 = pbi->tile_workers + uVar47;
        pDVar8 = pbi->thread_data;
        memcpy(pDVar8[uVar47].td,pbi,0x3b60);
        pTVar9 = pDVar8[uVar47].td;
        (pTVar9->dcb).corrupted = 0;
        (pTVar9->dcb).mc_buf[0] = pTVar9->mc_buf[0];
        ((pDVar8[uVar47].td)->dcb).mc_buf[1] = (pDVar8[uVar47].td)->mc_buf[1];
        pTVar9 = pDVar8[uVar47].td;
        (pTVar9->dcb).xd.tmp_conv_dst = pTVar9->tmp_conv_dst;
        if (uVar47 != 0) {
          (pTVar9->dcb).xd.seg_mask = pTVar9->seg_mask;
        }
        lVar42 = 0;
        do {
          pTVar9 = pDVar8[uVar47].td;
          (pTVar9->dcb).xd.tmp_obmc_bufs[lVar42] = pTVar9->tmp_obmc_bufs[lVar42];
          lVar42 = lVar42 + 1;
        } while (lVar42 == 1);
        (*pAVar34->sync)(pAVar55);
        pAVar55->hook = row_mt_worker_hook;
        pAVar55->data1 = pDVar8 + uVar47;
        pAVar55->data2 = pbi;
        uVar47 = uVar47 + 1;
      } while (uVar47 != uVar40);
    }
    pAVar34 = aom_get_worker_interface();
    if (0 < (int)uVar44) {
      lVar42 = uVar40 + 1;
      lVar53 = uVar40 * 0x38;
      do {
        pAVar10 = pbi->tile_workers;
        pAVar55 = (AVxWorker *)((long)&pAVar10[-1].impl_ + lVar53);
        *(uint8_t **)(*(long *)((long)&pAVar10[-1].data1 + lVar53) + 8) = data_end;
        *(undefined4 *)((long)&pAVar10[-1].had_error + lVar53) = 0;
        if (lVar42 == 2) {
          (*pAVar34->execute)(pAVar55);
        }
        else {
          (*pAVar34->launch)(pAVar55);
        }
        lVar42 = lVar42 + -1;
        lVar53 = lVar53 + -0x38;
      } while (1 < lVar42);
    }
    pAVar34 = aom_get_worker_interface();
    corrupted = 0;
    if (0 < (int)uVar44) {
      lVar53 = uVar40 + 1;
      lVar42 = uVar40 * 0x38;
      do {
        iVar52 = (*pAVar34->sync)((AVxWorker *)((long)&pbi->tile_workers[-1].impl_ + lVar42));
        aom_merge_corrupted_flag(&corrupted,(uint)(iVar52 == 0));
        lVar53 = lVar53 + -1;
        lVar42 = lVar42 + -0x38;
      } while (1 < lVar53);
    }
    (pbi->dcb).corrupted = corrupted;
    if (corrupted != 0) {
      aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Failed to decode tile data");
    }
    uVar48 = (pbi->common).tiles.large_scale;
    data = local_140;
joined_r0x009f5c3c:
    if (uVar48 == 0) {
      pTVar27 = pbi->tile_data;
LAB_009f6d7a:
      pTVar27 = pTVar27 + end_tile;
    }
    else {
      if (uVar43 != 1) goto LAB_009f4dc3;
      pTVar27 = pbi->tile_data;
    }
LAB_009f6d8e:
    data = aom_reader_find_end(&pTVar27->bit_reader);
  }
LAB_009f4dc3:
  *local_58 = data;
  if (uVar4 != '\0') {
    pSVar6 = (pbi->common).seq_params;
    pYVar7 = (pbi->dcb).xd.cur_buf;
    if (pSVar6->use_highbitdepth == '\0') {
      lVar42 = 1;
      do {
        if (0 < (pYVar7->field_3).field_0.uv_crop_height) {
          iVar52 = 0;
          do {
            memset(pYVar7->store_buf_adr[lVar42 + -4] +
                   (long)(pYVar7->field_4).field_0.uv_stride * (long)iVar52,0x80,
                   (long)(pYVar7->field_2).field_0.uv_crop_width);
            iVar52 = iVar52 + 1;
          } while (iVar52 < (pYVar7->field_3).field_0.uv_crop_height);
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != 3);
    }
    else {
      aVar18 = pSVar6->bit_depth;
      lVar42 = 1;
      do {
        auVar22 = _DAT_00c40100;
        auVar21 = _DAT_00c400f0;
        auVar20 = _DAT_00c400d0;
        auVar19 = _DAT_00c30d80;
        if (0 < (pYVar7->field_3).field_0.uv_crop_height) {
          __src = (void *)((long)pYVar7->store_buf_adr[lVar42 + -4] * 2);
          lVar53 = (long)(pYVar7->field_2).field_0.uv_crop_width;
          if (lVar53 != 0) {
            lVar33 = lVar53 + -1;
            auVar58._8_4_ = (int)lVar33;
            auVar58._0_8_ = lVar33;
            auVar58._12_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar58 = auVar58 ^ _DAT_00c30d80;
            uVar40 = 0;
            do {
              auVar68._8_4_ = (int)uVar40;
              auVar68._0_8_ = uVar40;
              auVar68._12_4_ = (int)(uVar40 >> 0x20);
              auVar60 = (auVar68 | auVar22) ^ auVar19;
              iVar52 = auVar58._0_4_;
              iVar24 = -(uint)(iVar52 < auVar60._0_4_);
              iVar49 = auVar58._4_4_;
              auVar61._4_4_ = -(uint)(iVar49 < auVar60._4_4_);
              iVar73 = auVar58._8_4_;
              iVar75 = -(uint)(iVar73 < auVar60._8_4_);
              iVar25 = auVar58._12_4_;
              auVar61._12_4_ = -(uint)(iVar25 < auVar60._12_4_);
              auVar70._4_4_ = iVar24;
              auVar70._0_4_ = iVar24;
              auVar70._8_4_ = iVar75;
              auVar70._12_4_ = iVar75;
              auVar76 = pshuflw(in_XMM5,auVar70,0xe8);
              auVar63._4_4_ = -(uint)(auVar60._4_4_ == iVar49);
              auVar63._12_4_ = -(uint)(auVar60._12_4_ == iVar25);
              auVar63._0_4_ = auVar63._4_4_;
              auVar63._8_4_ = auVar63._12_4_;
              auVar78 = pshuflw(in_XMM6,auVar63,0xe8);
              auVar61._0_4_ = auVar61._4_4_;
              auVar61._8_4_ = auVar61._12_4_;
              auVar77 = pshuflw(auVar76,auVar61,0xe8);
              auVar60._8_4_ = 0xffffffff;
              auVar60._0_8_ = 0xffffffffffffffff;
              auVar60._12_4_ = 0xffffffff;
              auVar60 = (auVar77 | auVar78 & auVar76) ^ auVar60;
              auVar60 = packssdw(auVar60,auVar60);
              uVar38 = (undefined2)(1 << ((char)aVar18 - 1 & 0x1f));
              if ((auVar60 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2) = uVar38;
              }
              auVar61 = auVar63 & auVar70 | auVar61;
              auVar60 = packssdw(auVar61,auVar61);
              auVar77._8_4_ = 0xffffffff;
              auVar77._0_8_ = 0xffffffffffffffff;
              auVar77._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar77,auVar60 ^ auVar77);
              if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 2) = uVar38;
              }
              auVar60 = (auVar68 | auVar21) ^ auVar19;
              iVar24 = -(uint)(iVar52 < auVar60._0_4_);
              auVar74._4_4_ = -(uint)(iVar49 < auVar60._4_4_);
              iVar75 = -(uint)(iVar73 < auVar60._8_4_);
              auVar74._12_4_ = -(uint)(iVar25 < auVar60._12_4_);
              auVar62._4_4_ = iVar24;
              auVar62._0_4_ = iVar24;
              auVar62._8_4_ = iVar75;
              auVar62._12_4_ = iVar75;
              auVar69._4_4_ = -(uint)(auVar60._4_4_ == iVar49);
              auVar69._12_4_ = -(uint)(auVar60._12_4_ == iVar25);
              auVar69._0_4_ = auVar69._4_4_;
              auVar69._8_4_ = auVar69._12_4_;
              auVar74._0_4_ = auVar74._4_4_;
              auVar74._8_4_ = auVar74._12_4_;
              auVar60 = auVar69 & auVar62 | auVar74;
              auVar60 = packssdw(auVar60,auVar60);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar11,auVar60 ^ auVar11);
              if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 4) = uVar38;
              }
              auVar63 = pshufhw(auVar62,auVar62,0x84);
              auVar70 = pshufhw(auVar69,auVar69,0x84);
              auVar61 = pshufhw(auVar63,auVar74,0x84);
              auVar64._8_4_ = 0xffffffff;
              auVar64._0_8_ = 0xffffffffffffffff;
              auVar64._12_4_ = 0xffffffff;
              auVar64 = (auVar61 | auVar70 & auVar63) ^ auVar64;
              auVar63 = packssdw(auVar64,auVar64);
              if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 6) = uVar38;
              }
              auVar63 = (auVar68 | _DAT_00c400e0) ^ auVar19;
              iVar24 = -(uint)(iVar52 < auVar63._0_4_);
              auVar66._4_4_ = -(uint)(iVar49 < auVar63._4_4_);
              iVar75 = -(uint)(iVar73 < auVar63._8_4_);
              auVar66._12_4_ = -(uint)(iVar25 < auVar63._12_4_);
              auVar71._4_4_ = iVar24;
              auVar71._0_4_ = iVar24;
              auVar71._8_4_ = iVar75;
              auVar71._12_4_ = iVar75;
              auVar60 = pshuflw(auVar60,auVar71,0xe8);
              auVar65._4_4_ = -(uint)(auVar63._4_4_ == iVar49);
              auVar65._12_4_ = -(uint)(auVar63._12_4_ == iVar25);
              auVar65._0_4_ = auVar65._4_4_;
              auVar65._8_4_ = auVar65._12_4_;
              auVar63 = pshuflw(auVar78 & auVar76,auVar65,0xe8);
              in_XMM6 = auVar63 & auVar60;
              auVar66._0_4_ = auVar66._4_4_;
              auVar66._8_4_ = auVar66._12_4_;
              auVar60 = pshuflw(auVar60,auVar66,0xe8);
              auVar76._8_4_ = 0xffffffff;
              auVar76._0_8_ = 0xffffffffffffffff;
              auVar76._12_4_ = 0xffffffff;
              auVar76 = (auVar60 | in_XMM6) ^ auVar76;
              in_XMM5 = packssdw(auVar76,auVar76);
              if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 8) = uVar38;
              }
              auVar66 = auVar65 & auVar71 | auVar66;
              auVar60 = packssdw(auVar66,auVar66);
              auVar78._8_4_ = 0xffffffff;
              auVar78._0_8_ = 0xffffffffffffffff;
              auVar78._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar78,auVar60 ^ auVar78);
              if ((auVar60 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 10) = uVar38;
              }
              auVar60 = (auVar68 | auVar20) ^ auVar19;
              iVar52 = -(uint)(iVar52 < auVar60._0_4_);
              auVar72._4_4_ = -(uint)(iVar49 < auVar60._4_4_);
              iVar73 = -(uint)(iVar73 < auVar60._8_4_);
              auVar72._12_4_ = -(uint)(iVar25 < auVar60._12_4_);
              auVar67._4_4_ = iVar52;
              auVar67._0_4_ = iVar52;
              auVar67._8_4_ = iVar73;
              auVar67._12_4_ = iVar73;
              auVar59._4_4_ = -(uint)(auVar60._4_4_ == iVar49);
              auVar59._12_4_ = -(uint)(auVar60._12_4_ == iVar25);
              auVar59._0_4_ = auVar59._4_4_;
              auVar59._8_4_ = auVar59._12_4_;
              auVar72._0_4_ = auVar72._4_4_;
              auVar72._8_4_ = auVar72._12_4_;
              auVar60 = auVar59 & auVar67 | auVar72;
              auVar60 = packssdw(auVar60,auVar60);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 ^ auVar12,auVar60 ^ auVar12);
              if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 0xc) = uVar38;
              }
              auVar68 = pshufhw(auVar67,auVar67,0x84);
              auVar60 = pshufhw(auVar59,auVar59,0x84);
              auVar63 = pshufhw(auVar68,auVar72,0x84);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar60 = packssdw(auVar60 & auVar68,(auVar63 | auVar60 & auVar68) ^ auVar13);
              if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)__src + uVar40 * 2 + 0xe) = uVar38;
              }
              uVar40 = uVar40 + 8;
            } while ((lVar53 + 7U & 0xfffffffffffffff8) != uVar40);
          }
          if (1 < (pYVar7->field_3).field_0.uv_crop_height) {
            iVar52 = 1;
            do {
              memcpy((void *)((long)__src +
                             (long)(pYVar7->field_4).field_0.uv_stride * (long)iVar52 * 2),__src,
                     (long)(pYVar7->field_2).field_0.uv_crop_width * 2);
              iVar52 = iVar52 + 1;
            } while (iVar52 < (pYVar7->field_3).field_0.uv_crop_height);
          }
        }
        lVar42 = lVar42 + 1;
      } while (lVar42 != 3);
    }
  }
  if ((pbi->common).tiles.cols * (pbi->common).tiles.rows + -1 != end_tile) {
    return;
  }
  cdef_sync = &pbi->cdef_sync;
  av1_alloc_cdef_buffers(cm_00,&pbi->cdef_worker,cdef_sync,pbi->num_workers,1);
  av1_alloc_cdef_sync(cm_00,cdef_sync,pbi->num_workers);
  if (((pbi->common).features.allow_intrabc == false) &&
     ((pbi->common).tiles.single_tile_decoding == 0)) {
    if (((pbi->common).lf.filter_level[0] != 0) || ((pbi->common).lf.filter_level[1] != 0)) {
      av1_loop_filter_frame_mt
                (&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,0,
                 (uint)(uVar4 == '\0') * 2 + 1,0,pbi->tile_workers,pbi->num_workers,
                 &pbi->lf_row_sync,0);
    }
    if ((pbi->skip_loop_filter == 0) && ((pbi->common).features.coded_lossless == false)) {
      bVar57 = true;
      if (((pbi->common).cdef_info.cdef_bits == 0) &&
         ((pbi->common).cdef_info.cdef_strengths[0] == 0)) {
        bVar57 = (pbi->common).cdef_info.cdef_uv_strengths[0] != 0;
      }
    }
    else {
      bVar57 = false;
    }
    bVar35 = ~bVar57 & (pbi->common).width == (pbi->common).superres_upscaled_width;
    bVar56 = true;
    if (((pbi->common).rst_info[0].frame_restoration_type == RESTORE_NONE) &&
       ((pbi->common).rst_info[1].frame_restoration_type == RESTORE_NONE)) {
      bVar56 = (pbi->common).rst_info[2].frame_restoration_type != RESTORE_NONE;
    }
    if (bVar35 == 0) {
      if (bVar56) {
        av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,0);
      }
      if (bVar57 != false) {
        if (pbi->num_workers < 2) {
          av1_cdef_frame(&((pbi->common).cur_frame)->buf,cm_00,(MACROBLOCKD *)pbi,
                         av1_cdef_init_fb_row);
        }
        else {
          av1_cdef_frame_mt(cm_00,(MACROBLOCKD *)pbi,pbi->cdef_worker,pbi->tile_workers,cdef_sync,
                            pbi->num_workers,av1_cdef_init_fb_row_mt,0);
        }
      }
      if ((pbi->common).width != (pbi->common).superres_upscaled_width) {
        av1_superres_upscale(cm_00,(pbi->common).buffer_pool,false);
      }
      if (!bVar56) goto LAB_009f517b;
      av1_loop_restoration_save_boundary_lines(&((pbi->common).cur_frame)->buf,cm_00,1);
    }
    else if (!bVar56) goto LAB_009f517b;
    pYVar7 = (pbi->dcb).xd.cur_buf;
    if (pbi->num_workers < 2) {
      av1_loop_restoration_filter_frame(pYVar7,cm_00,(uint)bVar35,&pbi->lr_ctxt);
    }
    else {
      av1_loop_restoration_filter_frame_mt
                (pYVar7,cm_00,(uint)bVar35,pbi->tile_workers,pbi->num_workers,&pbi->lr_row_sync,
                 &pbi->lr_ctxt,0);
    }
  }
LAB_009f517b:
  if ((pbi->dcb).corrupted == 0) {
    if ((pbi->common).features.refresh_frame_context == '\x01') {
      memcpy((pbi->common).fc,&pbi->tile_data[pbi->context_update_tile_id].tctx,0x52fc);
      av1_reset_cdf_symbol_counters((pbi->common).fc);
    }
  }
  else {
    aom_internal_error(&pbi->error,AOM_CODEC_CORRUPT_FRAME,"Decode failed. Frame data is corrupted."
                      );
  }
  if ((pbi->common).tiles.large_scale == 0) {
    memcpy(&((pbi->common).cur_frame)->frame_context,(pbi->common).fc,0x52fc);
  }
  if (((pbi->common).show_frame != 0) &&
     ((((pbi->common).seq_params)->order_hint_info).enable_order_hint == 0)) {
    puVar1 = &(pbi->common).current_frame.frame_number;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void av1_decode_tg_tiles_and_wrapup(AV1Decoder *pbi, const uint8_t *data,
                                    const uint8_t *data_end,
                                    const uint8_t **p_data_end, int start_tile,
                                    int end_tile, int initialize_flag) {
  AV1_COMMON *const cm = &pbi->common;
  CommonTileParams *const tiles = &cm->tiles;
  MACROBLOCKD *const xd = &pbi->dcb.xd;
  const int tile_count_tg = end_tile - start_tile + 1;

  xd->error_info = cm->error;
  if (initialize_flag) setup_frame_info(pbi);
  const int num_planes = av1_num_planes(cm);

  if (pbi->max_threads > 1 && !(tiles->large_scale && !pbi->ext_tile_debug) &&
      pbi->row_mt)
    *p_data_end =
        decode_tiles_row_mt(pbi, data, data_end, start_tile, end_tile);
  else if (pbi->max_threads > 1 && tile_count_tg > 1 &&
           !(tiles->large_scale && !pbi->ext_tile_debug))
    *p_data_end = decode_tiles_mt(pbi, data, data_end, start_tile, end_tile);
  else
    *p_data_end = decode_tiles(pbi, data, data_end, start_tile, end_tile);

  // If the bit stream is monochrome, set the U and V buffers to a constant.
  if (num_planes < 3) {
    set_planes_to_neutral_grey(cm->seq_params, xd->cur_buf, 1);
  }

  if (end_tile != tiles->rows * tiles->cols - 1) {
    return;
  }

  av1_alloc_cdef_buffers(cm, &pbi->cdef_worker, &pbi->cdef_sync,
                         pbi->num_workers, 1);
  av1_alloc_cdef_sync(cm, &pbi->cdef_sync, pbi->num_workers);

  if (!cm->features.allow_intrabc && !tiles->single_tile_decoding) {
    if (cm->lf.filter_level[0] || cm->lf.filter_level[1]) {
      av1_loop_filter_frame_mt(&cm->cur_frame->buf, cm, &pbi->dcb.xd, 0,
                               num_planes, 0, pbi->tile_workers,
                               pbi->num_workers, &pbi->lf_row_sync, 0);
    }

    const int do_cdef =
        !pbi->skip_loop_filter && !cm->features.coded_lossless &&
        (cm->cdef_info.cdef_bits || cm->cdef_info.cdef_strengths[0] ||
         cm->cdef_info.cdef_uv_strengths[0]);
    const int do_superres = av1_superres_scaled(cm);
    const int optimized_loop_restoration = !do_cdef && !do_superres;
    const int do_loop_restoration =
        cm->rst_info[0].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[1].frame_restoration_type != RESTORE_NONE ||
        cm->rst_info[2].frame_restoration_type != RESTORE_NONE;
    // Frame border extension is not required in the decoder
    // as it happens in extend_mc_border().
    int do_extend_border_mt = 0;
    if (!optimized_loop_restoration) {
      if (do_loop_restoration)
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 0);

      if (do_cdef) {
        if (pbi->num_workers > 1) {
          av1_cdef_frame_mt(cm, &pbi->dcb.xd, pbi->cdef_worker,
                            pbi->tile_workers, &pbi->cdef_sync,
                            pbi->num_workers, av1_cdef_init_fb_row_mt,
                            do_extend_border_mt);
        } else {
          av1_cdef_frame(&pbi->common.cur_frame->buf, cm, &pbi->dcb.xd,
                         av1_cdef_init_fb_row);
        }
      }

      superres_post_decode(pbi);

      if (do_loop_restoration) {
        av1_loop_restoration_save_boundary_lines(&pbi->common.cur_frame->buf,
                                                 cm, 1);
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    } else {
      // In no cdef and no superres case. Provide an optimized version of
      // loop_restoration_filter.
      if (do_loop_restoration) {
        if (pbi->num_workers > 1) {
          av1_loop_restoration_filter_frame_mt(
              (YV12_BUFFER_CONFIG *)xd->cur_buf, cm, optimized_loop_restoration,
              pbi->tile_workers, pbi->num_workers, &pbi->lr_row_sync,
              &pbi->lr_ctxt, do_extend_border_mt);
        } else {
          av1_loop_restoration_filter_frame((YV12_BUFFER_CONFIG *)xd->cur_buf,
                                            cm, optimized_loop_restoration,
                                            &pbi->lr_ctxt);
        }
      }
    }
  }

  if (!pbi->dcb.corrupted) {
    if (cm->features.refresh_frame_context == REFRESH_FRAME_CONTEXT_BACKWARD) {
      assert(pbi->context_update_tile_id < pbi->allocated_tiles);
      *cm->fc = pbi->tile_data[pbi->context_update_tile_id].tctx;
      av1_reset_cdf_symbol_counters(cm->fc);
    }
  } else {
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Decode failed. Frame data is corrupted.");
  }

#if CONFIG_INSPECTION
  if (pbi->inspect_cb != NULL) {
    (*pbi->inspect_cb)(pbi, pbi->inspect_ctx);
  }
#endif

  // Non frame parallel update frame context here.
  if (!tiles->large_scale) {
    cm->cur_frame->frame_context = *cm->fc;
  }

  if (cm->show_frame && !cm->seq_params->order_hint_info.enable_order_hint) {
    ++cm->current_frame.frame_number;
  }
}